

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

char * __thiscall
gl4cts::anon_unknown_0::BasicStdLayoutCase1CS::GetInput
          (BasicStdLayoutCase1CS *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data)

{
  long lVar1;
  
  lVar1 = -4;
  do {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data,4);
    *(float *)(in_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start = (float)((int)lVar1 + 5);
    in_data = in_data + 1;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0);
  return 
  "\nlayout(std430, binding = 0) buffer Input {\n  float data0;\n} g_input[4];\nlayout(std430, binding = 4) buffer Output {\n  float data0;\n} g_output[4];\nvoid main() {\n  for (int i = 0; i < 4; ++i) {\n    g_output[i].data0 = g_input[i].data0;\n  }\n}"
  ;
}

Assistant:

virtual const char* GetInput(std::vector<GLubyte> in_data[4])
	{
		return GetInputC1(in_data);
	}